

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffgkyc(fitsfile *fptr,char *keyname,float *value,char *comm,int *status)

{
  size_t sVar1;
  int *in_RCX;
  float *in_RDX;
  char *in_RSI;
  int *in_R8;
  int len;
  char message [81];
  char valstring [71];
  char local_d8 [64];
  int *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  char in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff89;
  int local_4;
  
  if (*in_R8 < 1) {
    ffgkey((fitsfile *)CONCAT71(in_stack_ffffffffffffff89,in_stack_ffffffffffffff88),
           in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
           in_stack_ffffffffffffff68);
    if (in_stack_ffffffffffffff88 == '(') {
      sVar1 = strcspn(&stack0xffffffffffffff88,")");
      (&stack0xffffffffffffff88)[(int)sVar1] = 0;
      sVar1 = strcspn(&stack0xffffffffffffff88,",");
      (&stack0xffffffffffffff88)[(int)sVar1] = 0;
      ffc2r(in_RSI,in_RDX,in_RCX);
      ffc2r(in_RSI,in_RDX,in_RCX);
      local_4 = *in_R8;
    }
    else {
      snprintf(local_d8,0x51,"keyword %s does not have a complex value (ffgkyc):",in_RSI);
      ffpmsg((char *)0x1cd1c0);
      ffpmsg((char *)0x1cd1ca);
      *in_R8 = 0x198;
      local_4 = 0x198;
    }
  }
  else {
    local_4 = *in_R8;
  }
  return local_4;
}

Assistant:

int ffgkyc( fitsfile *fptr,     /* I - FITS file pointer         */
            const char  *keyname,     /* I - name of keyword to read   */
            float *value,       /* O - keyword value (real,imag) */
            char  *comm,        /* O - keyword comment           */
            int   *status)      /* IO - error status             */
/*
  Read (get) the named keyword, returning the value and comment.
  The keyword must have a complex value. No implicit data conversion
  will be performed.
*/
{
    char valstring[FLEN_VALUE], message[FLEN_ERRMSG];
    int len;

    if (*status > 0)
        return(*status);

    ffgkey(fptr, keyname, valstring, comm, status);  /* read the keyword */

    if (valstring[0] != '(' )   /* test that this is a complex keyword */
    {
      snprintf(message, FLEN_ERRMSG, "keyword %s does not have a complex value (ffgkyc):",
              keyname);
      ffpmsg(message);
      ffpmsg(valstring);
      return(*status = BAD_C2F);
    }

    valstring[0] = ' ';            /* delete the opening parenthesis */
    len = strcspn(valstring, ")" );  
    valstring[len] = '\0';         /* delete the closing parenthesis */

    len = strcspn(valstring, ",");
    valstring[len] = '\0';

    ffc2r(valstring, &value[0], status);       /* convert the real part */
    ffc2r(&valstring[len + 1], &value[1], status); /* convert imag. part */
    return(*status);
}